

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[24],char_const(&)[7],kj::String,char_const(&)[3],char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [24],char (*params_1) [7],
          String *params_2,char (*params_3) [3],char (*params_4) [3])

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  ArrayPtr<const_char> local_80;
  kj *local_70;
  size_t local_68;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_68 = strlen((char *)this);
  local_70 = this;
  local_80.size_ = strlen(*params);
  pcVar1 = *(char **)(params_1[1] + 1);
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = *(char **)params_1;
  }
  local_40.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_40.size_ = (size_t)(pcVar1 + -1);
  }
  local_80.ptr = *params;
  local_50.size_ = strlen((char *)params_2);
  local_50.ptr = (char *)params_2;
  local_60.size_ = strlen(*params_3);
  local_60.ptr = *params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_70,&local_80,&local_40,&local_50,&local_60,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}